

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

double __thiscall mpt::message_store::log(message_store *this,double __x)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  metatype *pmVar4;
  long pos;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  __va_list_tag *in_R8;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  double dVar5;
  undefined4 extraout_XMM0_Db_00;
  bool local_99;
  entry local_80;
  entry m;
  va_list tmp;
  int ret;
  metatype *mt;
  int code;
  int pass;
  int save;
  __va_list_tag *arg_local;
  char *fmt_local;
  int type_local;
  char *from_local;
  message_store *this_local;
  
  uVar2 = in_EDX & 0x7f;
  if (uVar2 == 0) {
    code = this->_flags & 0x10;
    bVar1 = this->_flags & 8;
  }
  else if (uVar2 < this->_ignore) {
    code = 1;
    bVar1 = this->_flags & 2;
  }
  else {
    local_99 = false;
    if ((in_EDX & 0x20) != 0) {
      local_99 = (this->_flags & 0x40) != 0;
    }
    code = (int)local_99;
    bVar1 = this->_flags & 1;
  }
  if ((in_EDX & 0x20) != 0) {
    bVar1 = this->_flags & 4 | bVar1;
  }
  pmVar4 = reference<mpt::metatype>::instance(&this->super_reference<mpt::metatype>);
  if (code == 0) {
    dVar5 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    if ((pmVar4 != (metatype *)0x0) &&
       (dVar5 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da), bVar1 != 0)) {
      dVar5 = (double)mpt_convertable_vlog(pmVar4,in_RSI,in_EDX,in_RCX,in_R8);
    }
  }
  else {
    if ((pmVar4 != (metatype *)0x0) && (bVar1 != 0)) {
      m.super_array._buf._ref._0_4_ = in_R8->gp_offset;
      m.super_array._buf._ref._4_4_ = in_R8->fp_offset;
      mpt_convertable_vlog(pmVar4,in_RSI,in_EDX,in_RCX,&m);
    }
    entry::entry(&local_80);
    if ((uVar2 != 0) && (uVar2 < this->_level)) {
      this->_level = (uint8_t)uVar2;
    }
    iVar3 = entry::set(&local_80,in_RSI,in_EDX,in_RCX,in_R8);
    if (-1 < iVar3) {
      pos = unique_array<mpt::message_store::entry>::length
                      (&(this->_msg).super_unique_array<mpt::message_store::entry>);
      typed_array<mpt::message_store::entry>::insert(&this->_msg,pos,&local_80);
    }
    entry::~entry(&local_80);
    dVar5 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  }
  return dVar5;
}

Assistant:

int message_store::log(const char *from, int type, const char *fmt, va_list arg)
{
	int save = 0, pass = 0, code = 0x7f & type;
	
	if (!code) {
		save |= _flags & SaveMessage;
		pass |= _flags & PassMessage;
	}
	else if (code >= _ignore) {
		save = (type & File) && (_flags & SaveLogAll);
		pass |= _flags & PassUnsaved;
	} else {
		save = 1;
		pass |= _flags & PassSaved;
	}
	if (type & File) {
		pass |= _flags & PassFile;
	}
	metatype *mt = instance();
	// fast-track without argument list copy
	if (!save) {
		if (mt && pass) {
			return mpt_convertable_vlog(mt, from, type, fmt, arg);
		}
		return 0;
	}
	int ret;
	if (mt && pass) {
		va_list tmp;
		// use copy to keep data for storage operation
		va_copy(tmp, arg);
		ret = mpt_convertable_vlog(mt, from, type, fmt, tmp);
		va_end(tmp);
	}
	entry m;
	
	if (code && code < _level) _level = code;
	
	if ((ret = m.set(from, type, fmt, arg)) < 0) {
		return ret;
	}
	if (!_msg.insert(_msg.length(), m)) {
		return -1;
	}
	return ret;
}